

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void __thiscall
btHashedOverlappingPairCache::removeOverlappingPairsContainingProxy
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy,btDispatcher *dispatcher)

{
  undefined8 in_RDX;
  btBroadphaseProxy *in_RDI;
  RemovePairCallback removeCallback;
  RemovePairCallback *this_00;
  RemovePairCallback local_28;
  undefined8 local_18;
  
  this_00 = &local_28;
  local_18 = in_RDX;
  removeOverlappingPairsContainingProxy::RemovePairCallback::RemovePairCallback(this_00,in_RDI);
  (**(code **)((long)in_RDI->m_clientObject + 0x60))(in_RDI,this_00,local_18);
  removeOverlappingPairsContainingProxy::RemovePairCallback::~RemovePairCallback
            ((RemovePairCallback *)0x166a73);
  return;
}

Assistant:

void	btHashedOverlappingPairCache::removeOverlappingPairsContainingProxy(btBroadphaseProxy* proxy,btDispatcher* dispatcher)
{

	class	RemovePairCallback : public btOverlapCallback
	{
		btBroadphaseProxy* m_obsoleteProxy;

	public:
		RemovePairCallback(btBroadphaseProxy* obsoleteProxy)
			:m_obsoleteProxy(obsoleteProxy)
		{
		}
		virtual	bool	processOverlap(btBroadphasePair& pair)
		{
			return ((pair.m_pProxy0 == m_obsoleteProxy) ||
				(pair.m_pProxy1 == m_obsoleteProxy));
		}
		
	};


	RemovePairCallback removeCallback(proxy);

	processAllOverlappingPairs(&removeCallback,dispatcher);
}